

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_60e82::CommandTask::inputsAvailable(CommandTask *this,TaskInterface ti)

{
  Command *desc;
  uint uVar1;
  work_fn_ty local_88;
  QueueJob local_68;
  QueueJobContext local_40;
  DetachedContext ctx;
  anon_class_24_2_e88081f0 fn;
  CommandTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (CommandTask *)ti.impl;
  ctx.super_QueueJobContext._vptr_QueueJobContext = (QueueJobContext)(QueueJobContext)this;
  uVar1 = (*(this->command->super_JobDescriptor)._vptr_JobDescriptor[0x13])();
  if ((uVar1 & 1) == 0) {
    desc = this->command;
    std::function<void(llbuild::basic::QueueJobContext*)>::
    function<(anonymous_namespace)::CommandTask::inputsAvailable(llbuild::core::TaskInterface)::_lambda(llbuild::basic::QueueJobContext*)_1_,void>
              ((function<void(llbuild::basic::QueueJobContext*)> *)&local_88,
               (anon_class_24_2_e88081f0 *)&ctx);
    llbuild::basic::QueueJob::QueueJob(&local_68,&desc->super_JobDescriptor,&local_88);
    llbuild::core::TaskInterface::spawn((TaskInterface *)&this_local,&local_68,Normal);
    llbuild::basic::QueueJob::~QueueJob(&local_68);
    std::function<void_(llbuild::basic::QueueJobContext_*)>::~function(&local_88);
  }
  else {
    inputsAvailable::DetachedContext::DetachedContext((DetachedContext *)&local_40);
    inputsAvailable::anon_class_24_2_e88081f0::operator()
              ((anon_class_24_2_e88081f0 *)&ctx,&local_40);
    inputsAvailable::DetachedContext::~DetachedContext((DetachedContext *)&local_40);
  }
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    auto fn = [this, ti](QueueJobContext* context) mutable {
      // If the build should cancel, do nothing.
      if (ti.isCancelled()) {
        ti.complete(BuildValue::makeCancelledCommand().toData());
        return;
      }

      // Check if the command should be skipped.
      if (!getBuildSystem(ti).getDelegate().shouldCommandStart(&command)) {
        // We need to call commandFinished here because commandPreparing and
        // shouldCommandStart guarantee that they're followed by
        // commandFinished.
        getBuildSystem(ti).getDelegate().commandFinished(&command, ProcessStatus::Skipped);
        ti.complete(BuildValue::makeSkippedCommand().toData());
        return;
      }
    
      // Execute the command, with notifications to the delegate.
      command.execute(getBuildSystem(ti).getBuildSystem(), ti, context, [ti](BuildValue&& result) mutable {
        // Inform the engine of the result.
        if (result.isFailedCommand()) {
          getBuildSystem(ti).getDelegate().hadCommandFailure();
        }
        ti.complete(result.toData());
      });
    };
    if (command.isDetached()) {
      struct DetachedContext: public QueueJobContext {
        unsigned laneID() const override { return -1; }
      };
      DetachedContext ctx;
      fn(&ctx);
    } else {
      ti.spawn({ &command, std::move(fn) });
    }
  }